

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O1

_Bool os_mkdir(char *path,_Bool exist_ok)

{
  _Bool _Var1;
  int iVar2;
  undefined7 in_register_00000031;
  
  if (((int)CONCAT71(in_register_00000031,exist_ok) != 0) && (_Var1 = os_direxists(path), _Var1)) {
    return true;
  }
  iVar2 = mkdir(path,0x1fd);
  return iVar2 != -1;
}

Assistant:

bool os_mkdir(char *path, bool exist_ok) {
#if defined(__linux__) || defined(__FreeBSD__) || defined(__OpenBSD__) ||      \
    defined(__NetBSD__) || defined(__DragonFly__)
    if (exist_ok && os_direxists(path)) {
        return true;
    } else {
        mode_t mode = S_IRWXU | S_IRWXG | S_IROTH | S_IXOTH;
        int mkres = mkdir(path, mode);
        if (mkres == -1) {
            return false;
        } else {
            return true;
        }
    }

#elif __APPLE__
#error "TODO os_mkdir for APPLE platform"
#else
#error "TODO os_mkdir for WINDOWS platform"
#endif
}